

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteObservations.cpp
# Opt level: O1

bool __thiscall
MADPComponentDiscreteObservations::SetInitialized(MADPComponentDiscreteObservations *this,bool b)

{
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  size_t *psVar3;
  map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
  *pmVar4;
  E *this_00;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  undefined7 in_register_00000031;
  ulong uVar8;
  ulong uVar9;
  
  if ((int)CONCAT71(in_register_00000031,b) == 0) {
    if ((this->_m_initialized != false) && (this->_m_observationStepSize != (size_t *)0x0)) {
      operator_delete__(this->_m_observationStepSize);
    }
  }
  else {
    if (((this->_m_initialized & b) == 1) && (this->_m_observationStepSize != (size_t *)0x0)) {
      operator_delete__(this->_m_observationStepSize);
    }
    if (!b) {
      return true;
    }
    if ((this->_m_nrObservations).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish ==
        (this->_m_nrObservations).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      this_00 = (E *)__cxa_allocate_exception(0x28);
      E::E(this_00,"MADPComponentDiscreteObservations::SetInitialized() no observations specified");
      __cxa_throw(this_00,&E::typeinfo,E::~E);
    }
    psVar3 = IndexTools::CalculateStepSize(&this->_m_nrObservations);
    this->_m_observationStepSize = psVar3;
    if (this->_m_cachedAllJointObservations == false) {
      puVar2 = (this->_m_nrObservations).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar5 = (long)(this->_m_nrObservations).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2;
      if (lVar5 == 0) {
        uVar7 = 1;
      }
      else {
        uVar8 = 1;
        uVar6 = 1;
        do {
          uVar7 = puVar2[uVar8 - 1] * uVar6;
          if (uVar7 < uVar6) {
            this->_m_jointIndicesValid = false;
          }
          uVar9 = uVar8 & 0xffffffff;
          uVar8 = uVar8 + 1;
          uVar6 = uVar7;
        } while (lVar5 >> 3 != uVar9);
      }
      this->_m_nrJointObservations = uVar7;
      pmVar4 = (map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*>_>_>
                *)operator_new(0x30);
      p_Var1 = &(pmVar4->_M_t)._M_impl.super__Rb_tree_header;
      *(undefined8 *)&(pmVar4->_M_t)._M_impl = 0;
      *(undefined8 *)&(pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
      (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      (pmVar4->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      this->_m_jointObservationIndices = pmVar4;
    }
    else {
      this->_m_nrJointObservations =
           (long)(this->_m_jointObservationVec).
                 super__Vector_base<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->_m_jointObservationVec).
                 super__Vector_base<JointObservationDiscrete_*,_std::allocator<JointObservationDiscrete_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3;
    }
  }
  this->_m_initialized = b;
  return true;
}

Assistant:

bool MADPComponentDiscreteObservations::SetInitialized(bool b)
{
    if(b == false)
    {
        if(_m_initialized == true)
            delete [] _m_observationStepSize;
        _m_initialized = b;
        return true;
    }
    if(_m_initialized == true && b == true)
    {
        //first free mem before re-initialize:
        delete [] _m_observationStepSize;
    }
    if(b == true)
    {
        if(_m_nrObservations.size() == 0)
            throw(E("MADPComponentDiscreteObservations::SetInitialized() no observations specified"));
        _m_observationStepSize=
            IndexTools::CalculateStepSize(_m_nrObservations);

        if(!_m_cachedAllJointObservations)
        {
            size_t nrJO=1;
            size_t prevNrJO=nrJO;
            for(Index i=0;i!=_m_nrObservations.size();++i)
            {
                nrJO*=_m_nrObservations[i];
                // detect overflow
                if(nrJO<prevNrJO)
                    _m_jointIndicesValid=false;
                prevNrJO=nrJO;
            }
            _m_nrJointObservations=nrJO;
            _m_jointObservationIndices=
                new map<Index, vector<Index> *>();
        }
        else
            _m_nrJointObservations=_m_jointObservationVec.size();
        _m_initialized = b;
    }    
    return(true);
}